

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_butcher.c
# Opt level: O1

void ARKodeButcherTable_Free(ARKodeButcherTable B)

{
  long lVar1;
  
  if (B != (ARKodeButcherTable)0x0) {
    if (B->d != (realtype *)0x0) {
      free(B->d);
    }
    if (B->c != (realtype *)0x0) {
      free(B->c);
    }
    if (B->b != (realtype *)0x0) {
      free(B->b);
    }
    if (B->A != (realtype **)0x0) {
      if (0 < B->stages) {
        lVar1 = 0;
        do {
          if (B->A[lVar1] != (realtype *)0x0) {
            free(B->A[lVar1]);
          }
          lVar1 = lVar1 + 1;
        } while (lVar1 < B->stages);
      }
      free(B->A);
    }
    free(B);
    return;
  }
  return;
}

Assistant:

void ARKodeButcherTable_Free(ARKodeButcherTable B)
{
  int i;

  /* Free each field within Butcher table structure, and then
     free structure itself */
  if (B != NULL) {
    if (B->d != NULL)  free(B->d);
    if (B->c != NULL)  free(B->c);
    if (B->b != NULL)  free(B->b);
    if (B->A != NULL) {
      for (i=0; i<B->stages; i++)
        if (B->A[i] != NULL)  free(B->A[i]);
      free(B->A);
    }

    free(B);
  }
}